

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

int INT_EVdfg_assign_node(EVdfg_stone stone,char *node_name)

{
  EVmaster p_Var1;
  EVint_node_list p_Var2;
  char *pcVar3;
  FILE *__stream;
  EVdfg_config_action act_00;
  int iVar4;
  int iVar5;
  __pid_t _Var6;
  pthread_t pVar7;
  EVdfg p_Var8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  EVdfg_config_action act;
  
  p_Var8 = stone->dfg;
  p_Var1 = p_Var8->master;
  uVar9 = 0;
  uVar10 = (ulong)(uint)p_Var1->node_count;
  if (p_Var1->node_count < 1) {
    uVar10 = uVar9;
  }
  uVar11 = 0xffffffffffffffff;
  lVar12 = 8;
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    p_Var2 = p_Var1->nodes;
    pcVar3 = *(char **)((long)&p_Var2->name + lVar12);
    if ((pcVar3 == (char *)0x0) || (iVar4 = strcmp(pcVar3,node_name), iVar4 != 0)) {
      pcVar3 = *(char **)((long)p_Var2 + lVar12 + -8);
      if (pcVar3 != (char *)0x0) {
        iVar4 = strcmp(pcVar3,node_name);
        if (iVar4 == 0) {
          uVar11 = uVar9;
        }
        uVar11 = uVar11 & 0xffffffff;
      }
    }
    else {
      uVar11 = uVar9 & 0xffffffff;
    }
    lVar12 = lVar12 + 0x38;
  }
  iVar4 = (int)uVar11;
  if (iVar4 == -1) {
    iVar5 = 0;
    printf("Node \"%s\" not found in node list\n",node_name);
  }
  else {
    if (p_Var8->realized == 1) {
      iVar5 = CMtrace_val[0xd];
      if (p_Var1->cm->CMTrace_file == (FILE *)0x0) {
        iVar5 = CMtrace_init(p_Var1->cm,EVdfgVerbose);
      }
      if (iVar5 != 0) {
        if (CMtrace_PID != 0) {
          __stream = (FILE *)p_Var1->cm->CMTrace_file;
          _Var6 = getpid();
          pVar7 = pthread_self();
          fprintf(__stream,"P%lxT%lx - ",(long)_Var6,pVar7);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&act);
          fprintf((FILE *)p_Var1->cm->CMTrace_file,"%lld.%.9ld - ",CONCAT44(act.stone_id,act.type),
                  act._8_8_);
        }
        fprintf((FILE *)p_Var1->cm->CMTrace_file,"assign node, node# = %d\n",uVar11 & 0xffffffff);
      }
      fflush((FILE *)p_Var1->cm->CMTrace_file);
      p_Var8 = stone->dfg;
    }
    act.type = ACT_assign_node;
    act.stone_id = stone->stone_id;
    act_00.stone_id = act.stone_id;
    act_00.type = 0xc;
    act_00.u.period.usecs = act.u.period.usecs;
    act_00.u.period.secs = iVar4;
    act_00.node_for_action = act.node_for_action;
    act_00._12_4_ = act._12_4_;
    act_00.u._8_8_ = act.u._8_8_;
    iVar5 = 1;
    act.u.period.secs = iVar4;
    EVdfg_perform_act_on_state(p_Var8->working_state,act_00,1);
  }
  return iVar5;
}

Assistant:

extern int
INT_EVdfg_assign_node(EVdfg_stone stone, char *node_name)
{
    EVdfg dfg = stone->dfg;
    EVmaster master = dfg->master;
    int i, node = -1;
    for (i = 0; i < master->node_count; i++) {
	EVint_node_list n = &master->nodes[i];
	if (n->canonical_name && (strcmp(n->canonical_name, node_name) == 0)) {
	    node = i;
	} else 	if (n->name && (strcmp(n->name, node_name) == 0)) {
	    node = i;
	}

    }
    if (node == -1) {
	printf("Node \"%s\" not found in node list\n", node_name);
	return 0;
    }
	
    if (dfg->realized == 1) {
	CMtrace_out(master->cm, EVdfgVerbose, "assign node, node# = %d\n", node);
    }
    EVdfg_config_action act;
    act.type = ACT_assign_node;
    act.stone_id = stone->stone_id;
    act.u.assign.dest_node = node;
    (void) EVdfg_perform_act_on_state(stone->dfg->working_state, act, 1 /* add to queue */);
    return 1;
}